

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Dtc_ObjComputeTruth(Gia_Man_t *p,int iObj,int *pCut,int *pTruth)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  uint *puVar5;
  
  puVar5 = &DAT_0083284c;
  for (lVar4 = 1; lVar4 <= *pCut; lVar4 = lVar4 + 1) {
    uVar1 = *puVar5;
    pGVar2 = Gia_ManObj(p,pCut[lVar4]);
    pGVar2->Value = uVar1;
    puVar5 = puVar5 + 1;
  }
  pGVar2 = Gia_ManObj(p,iObj);
  uVar1 = Dtc_ObjComputeTruth_rec(pGVar2);
  pGVar2 = Gia_ManObj(p,iObj);
  Dtc_ObjCleanTruth_rec(pGVar2);
  if (pTruth != (int *)0x0) {
    *pTruth = uVar1 & 0xff;
  }
  uVar1 = uVar1 & 0xff;
  uVar3 = (ulong)(uVar1 - 0x66);
  if (uVar1 - 0x66 < 0x34) {
    if ((0x10000000800U >> (uVar3 & 0x3f) & 1) != 0) {
      return 2;
    }
    if ((0x1000000000008U >> (uVar3 & 0x3f) & 1) != 0) {
      return 1;
    }
    if ((0x8000000000001U >> (uVar3 & 0x3f) & 1) != 0) {
      return 3;
    }
  }
  if (((0x36 < uVar1 - 0x17) || ((0x40000000100001U >> ((ulong)(uVar1 - 0x17) & 0x3f) & 1) == 0)) &&
     ((0x36 < uVar1 - 0xb2 || ((0x40000400000001U >> ((ulong)(uVar1 - 0xb2) & 0x3f) & 1) == 0)))) {
    return 0;
  }
  return 2;
}

Assistant:

int Dtc_ObjComputeTruth( Gia_Man_t * p, int iObj, int * pCut, int * pTruth )
{
    unsigned Truth, Truths[3] = { 0xAA, 0xCC, 0xF0 }; int i;
    for ( i = 1; i <= pCut[0]; i++ )
        Gia_ManObj(p, pCut[i])->Value = Truths[i-1];
    Truth = 0xFF & Dtc_ObjComputeTruth_rec( Gia_ManObj(p, iObj) );
    Dtc_ObjCleanTruth_rec( Gia_ManObj(p, iObj) );
    if ( pTruth ) 
        *pTruth = Truth;
    if ( Truth == 0x66 || Truth == 0x99 )
        return 3;
    if ( Truth == 0x96 || Truth == 0x69 )
        return 1;
    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        return 2;
    return 0;
}